

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O1

int cmd_data(char *arg)

{
  int iVar1;
  int iVar2;
  undefined8 *__ptr;
  char *pcVar3;
  undefined8 *puVar4;
  FILE *__stream;
  size_t __size;
  lyd_node *plVar5;
  uint uVar6;
  lyd_node *plVar7;
  undefined4 local_64;
  lyd_node *plStack_60;
  int option_index;
  lyd_node *data;
  LYD_FORMAT local_50;
  int local_4c;
  lyd_node *local_48;
  FILE *local_40;
  uint local_38;
  uint local_34;
  
  local_34 = 0;
  plStack_60 = (lyd_node *)0x0;
  local_40 = _stdout;
  __ptr = (undefined8 *)malloc(0x10);
  pcVar3 = strdup(arg);
  *__ptr = pcVar3;
  strtok(pcVar3," ");
  pcVar3 = strtok((char *)0x0," ");
  if (pcVar3 == (char *)0x0) {
    uVar6 = 1;
  }
  else {
    __size = 0x18;
    uVar6 = 1;
    do {
      puVar4 = (undefined8 *)realloc(__ptr,__size);
      if (puVar4 == (undefined8 *)0x0) {
        cmd_data_cold_1();
        plVar7 = (lyd_node *)0x0;
        goto LAB_00108909;
      }
      *(char **)((long)puVar4 + (__size - 0x10)) = pcVar3;
      pcVar3 = strtok((char *)0x0," ");
      __size = __size + 8;
      uVar6 = uVar6 + 1;
      __ptr = puVar4;
    } while (pcVar3 != (char *)0x0);
  }
  __ptr[uVar6] = 0;
  _optind = 0;
  local_38 = 0;
  data = (lyd_node *)0x0;
  local_48 = (lyd_node *)0x0;
  local_4c = 0;
  local_50 = LYD_UNKNOWN;
switchD_0010842f_caseD_65:
  local_64 = 0;
  iVar1 = getopt_long(uVar6,__ptr,"d:hf:F:o:st:r:",cmd_data::long_options,&local_64);
  plVar7 = local_48;
  plVar5 = _optarg;
  if (iVar1 < 100) {
    if (iVar1 == 0x46) {
      iVar1 = strcmp((char *)_optarg,"xml");
      local_50 = LYD_XML;
      if (iVar1 != 0) {
        iVar1 = strcmp((char *)plVar5,"json");
        local_50 = LYD_JSON;
        if (iVar1 != 0) {
          iVar1 = strcmp((char *)plVar5,"lyb");
          local_50 = LYD_LYB;
          if (iVar1 != 0) {
            pcVar3 = "Unknown input format \"%s\".\n";
            goto LAB_0010897d;
          }
        }
      }
      goto switchD_0010842f_caseD_65;
    }
    if (iVar1 == -1) {
      if (_optind == uVar6) {
        cmd_data_cold_8();
        goto LAB_00108987;
      }
      iVar2 = parse_data((char *)__ptr[(int)_optind],local_50,(int *)&local_34,local_48,
                         (char *)__ptr[(long)(int)_optind + 1],&stack0xffffffffffffffa0);
      iVar1 = 1;
      __stream = local_40;
      if (iVar2 == 0) {
        if ((data == (lyd_node *)0x0) ||
           (__stream = fopen((char *)data,"w"), __stream != (FILE *)0x0)) {
          iVar1 = 0;
          if (local_4c != 0) {
            plVar5 = plStack_60;
            if ((local_34 & 0x20) != 0) {
              plVar5 = plStack_60->child;
            }
            lyd_print_file(__stream,plVar5,local_4c,local_38 | 3);
            iVar1 = 0;
          }
        }
        else {
          cmd_data_cold_7();
          __stream = (FILE *)0x0;
        }
      }
      goto LAB_0010890d;
    }
    if (iVar1 != 0x3f) goto switchD_0010842f_caseD_65;
    cmd_data_cold_2();
LAB_00108987:
    iVar1 = 1;
    __stream = local_40;
    plVar7 = local_48;
  }
  else {
    switch(iVar1) {
    case 100:
      iVar1 = strcmp((char *)_optarg,"all");
      if (iVar1 == 0) {
        local_38 = local_38 & 0xffffff0f | 0x20;
      }
      else {
        iVar1 = strcmp((char *)plVar5,"all-tagged");
        if (iVar1 == 0) {
          local_38 = local_38 & 0xffffff0f | 0x40;
        }
        else {
          iVar1 = strcmp((char *)plVar5,"trim");
          if (iVar1 == 0) {
            local_38 = local_38 & 0xffffff0f | 0x10;
          }
          else {
            iVar1 = strcmp((char *)plVar5,"implicit-tagged");
            if (iVar1 == 0) {
              local_38 = local_38 & 0xffffff0f | 0x80;
            }
          }
        }
      }
    default:
      goto switchD_0010842f_caseD_65;
    case 0x66:
      iVar1 = strcmp((char *)_optarg,"xml");
      local_4c = 1;
      if (iVar1 != 0) {
        iVar1 = strcmp((char *)plVar5,"json");
        local_4c = 2;
        if (iVar1 != 0) {
          iVar1 = strcmp((char *)plVar5,"lyb");
          local_4c = 3;
          if (iVar1 != 0) {
            pcVar3 = "Unknown output format \"%s\".\n";
LAB_0010897d:
            fprintf(_stderr,pcVar3,plVar5);
            goto LAB_00108987;
          }
        }
      }
      goto switchD_0010842f_caseD_65;
    case 0x68:
      cmd_data_help();
      iVar1 = 0;
      __stream = local_40;
      plVar7 = local_48;
      break;
    case 0x6f:
      if (data != (lyd_node *)0x0) {
        cmd_data_cold_6();
        goto LAB_00108987;
      }
      data = _optarg;
      goto switchD_0010842f_caseD_65;
    case 0x72:
      if ((local_48 == (lyd_node *)0x0) && (-1 < (short)local_34)) {
        if (*(char *)&_optarg->schema == '!') {
          local_34 = local_34 | 0x8000;
          local_48 = (lyd_node *)0x0;
        }
        else {
          local_48 = (lyd_node *)lyd_parse_path(ctx,_optarg,1,0x10000);
          if (local_48 == (lyd_node *)0x0) {
            cmd_data_cold_5();
            plVar7 = (lyd_node *)0x0;
            goto LAB_00108909;
          }
        }
        goto switchD_0010842f_caseD_65;
      }
      cmd_data_cold_4();
LAB_00108909:
      iVar1 = 1;
      __stream = local_40;
      break;
    case 0x73:
      local_34 = local_34 | 0xa00;
      goto switchD_0010842f_caseD_65;
    case 0x74:
      iVar1 = strcmp((char *)_optarg,"auto");
      if (iVar1 == 0) {
        local_34 = local_34 | 0x10000ff;
      }
      else {
        iVar1 = strcmp((char *)plVar5,"data");
        if (iVar1 == 0) {
          local_34 = local_34 & 0xfeffff00;
        }
        else {
          iVar1 = strcmp((char *)plVar5,"config");
          if (iVar1 == 0) {
            local_34 = (local_34 & 0xfeffff00) + 1;
          }
          else {
            iVar1 = strcmp((char *)plVar5,"get");
            if (iVar1 == 0) {
              local_34 = local_34 & 0xfeffff00 | 2;
            }
            else {
              iVar1 = strcmp((char *)plVar5,"getconfig");
              if (iVar1 == 0) {
                local_34 = local_34 & 0xfeffff00 | 4;
              }
              else {
                iVar1 = strcmp((char *)plVar5,"edit");
                if (iVar1 == 0) {
                  local_34 = local_34 & 0xfeffff00 | 8;
                }
                else {
                  iVar1 = strcmp((char *)plVar5,"rpc");
                  if (iVar1 == 0) {
                    local_34 = local_34 & 0xfeffff00 | 0x10;
                  }
                  else {
                    iVar1 = strcmp((char *)plVar5,"rpcreply");
                    if (iVar1 == 0) {
                      local_34 = local_34 & 0xfeffff00 | 0x20;
                    }
                    else {
                      iVar1 = strcmp((char *)plVar5,"notif");
                      if (iVar1 == 0) {
                        local_34 = local_34 & 0xfeffff00 | 0x40;
                      }
                      else {
                        iVar1 = strcmp((char *)plVar5,"yangdata");
                        if (iVar1 != 0) {
                          cmd_data_cold_3();
                          goto LAB_00108987;
                        }
                        local_34 = local_34 & 0xfeffff00 | 0x1000000;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto switchD_0010842f_caseD_65;
    }
  }
LAB_0010890d:
  free((void *)*__ptr);
  free(__ptr);
  if ((__stream != (FILE *)0x0) && (__stream != _stdout)) {
    fclose(__stream);
  }
  lyd_free_withsiblings(plVar7);
  lyd_free_withsiblings(plStack_60);
  return iVar1;
}

Assistant:

int
cmd_data(const char *arg)
{
    int c, argc, option_index, ret = 1;
    int options = 0, printopt = 0;
    char **argv = NULL, *ptr;
    const char *out_path = NULL;
    struct lyd_node *data = NULL, *val_tree = NULL;
    LYD_FORMAT outformat = LYD_UNKNOWN, informat = LYD_UNKNOWN;
    FILE *output = stdout;
    static struct option long_options[] = {
        {"defaults", required_argument, 0, 'd'},
        {"help", no_argument, 0, 'h'},
        {"format", required_argument, 0, 'f'},
        {"in-format", required_argument, 0, 'F'},
        {"option", required_argument, 0, 't'},
        {"output", required_argument, 0, 'o'},
        {"running", required_argument, 0, 'r'},
        {"strict", no_argument, 0, 's'},
        {NULL, 0, 0, 0}
    };
    void *rlcd;

    argc = 1;
    argv = malloc(2*sizeof *argv);
    *argv = strdup(arg);
    ptr = strtok(*argv, " ");
    while ((ptr = strtok(NULL, " "))) {
        rlcd = realloc(argv, (argc + 2) * sizeof *argv);
        if (!rlcd) {
            fprintf(stderr, "Memory allocation failed (%s:%d, %s)", __FILE__, __LINE__, strerror(errno));
            goto cleanup;
        }
        argv = rlcd;
        argv[argc++] = ptr;
    }
    argv[argc] = NULL;

    optind = 0;
    while (1) {
        option_index = 0;
        c = getopt_long(argc, argv, "d:hf:F:o:st:r:", long_options, &option_index);
        if (c == -1) {
            break;
        }

        switch (c) {
        case 'd':
            if (!strcmp(optarg, "all")) {
                printopt = (printopt & ~LYP_WD_MASK) | LYP_WD_ALL;
            } else if (!strcmp(optarg, "all-tagged")) {
                printopt = (printopt & ~LYP_WD_MASK) | LYP_WD_ALL_TAG;
            } else if (!strcmp(optarg, "trim")) {
                printopt = (printopt & ~LYP_WD_MASK) | LYP_WD_TRIM;
            } else if (!strcmp(optarg, "implicit-tagged")) {
                printopt = (printopt & ~LYP_WD_MASK) | LYP_WD_IMPL_TAG;
            }
            break;
        case 'h':
            cmd_data_help();
            ret = 0;
            goto cleanup;
        case 'f':
            if (!strcmp(optarg, "xml")) {
                outformat = LYD_XML;
            } else if (!strcmp(optarg, "json")) {
                outformat = LYD_JSON;
            } else if (!strcmp(optarg, "lyb")) {
                outformat = LYD_LYB;
            } else {
                fprintf(stderr, "Unknown output format \"%s\".\n", optarg);
                goto cleanup;
            }
            break;
        case 'F':
            if (!strcmp(optarg, "xml")) {
                informat = LYD_XML;
            } else if (!strcmp(optarg, "json")) {
                informat = LYD_JSON;
            } else if (!strcmp(optarg, "lyb")) {
                informat = LYD_LYB;
            } else {
                fprintf(stderr, "Unknown input format \"%s\".\n", optarg);
                goto cleanup;
            }
            break;
        case 'o':
            if (out_path) {
                fprintf(stderr, "Output specified twice.\n");
                goto cleanup;
            }
            out_path = optarg;
            break;
        case 'r':
            if (val_tree || (options & LYD_OPT_NOEXTDEPS)) {
                fprintf(stderr, "The running datastore (-r) cannot be set multiple times.\n");
                goto cleanup;
            }
            if (optarg[0] == '!') {
                /* ignore extenral dependencies to the running datastore */
                options |= LYD_OPT_NOEXTDEPS;
            } else {
                /* external file with the running datastore */
                val_tree = lyd_parse_path(ctx, optarg, LYD_XML, LYD_OPT_DATA_NO_YANGLIB);
                if (!val_tree) {
                    fprintf(stderr, "Failed to parse the additional data tree for validation.\n");
                    goto cleanup;
                }
            }
            break;
        case 's':
            options |= LYD_OPT_STRICT;
            options |= LYD_OPT_OBSOLETE;
            break;
        case 't':
            if (!strcmp(optarg, "auto")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_TYPEMASK;
            } else if (!strcmp(optarg, "data")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_DATA;
            } else if (!strcmp(optarg, "config")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_CONFIG;
            } else if (!strcmp(optarg, "get")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_GET;
            } else if (!strcmp(optarg, "getconfig")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_GETCONFIG;
            } else if (!strcmp(optarg, "edit")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_EDIT;
            } else if (!strcmp(optarg, "rpc")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_RPC;
            } else if (!strcmp(optarg, "rpcreply")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_RPCREPLY;
            } else if (!strcmp(optarg, "notif")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_NOTIF;
            } else if (!strcmp(optarg, "yangdata")) {
                options = (options & ~LYD_OPT_TYPEMASK) | LYD_OPT_DATA_TEMPLATE;
            } else {
                fprintf(stderr, "Invalid parser option \"%s\".\n", optarg);
                cmd_data_help();
                goto cleanup;
            }
            break;
        case '?':
            fprintf(stderr, "Unknown option \"%d\".\n", (char)c);
            goto cleanup;
        }
    }

    /* file name */
    if (optind == argc) {
        fprintf(stderr, "Missing the data file name.\n");
        goto cleanup;
    }

    if (parse_data(argv[optind], informat, &options, val_tree, argv[optind + 1], &data)) {
        goto cleanup;
    }

    if (out_path) {
        output = fopen(out_path, "w");
        if (!output) {
            fprintf(stderr, "Could not open the output file (%s).\n", strerror(errno));
            goto cleanup;
        }
    }

    if (outformat != LYD_UNKNOWN) {
        if (options & LYD_OPT_RPCREPLY) {
            lyd_print_file(output, data->child, outformat, LYP_WITHSIBLINGS | LYP_FORMAT | printopt);
        } else {
            lyd_print_file(output, data, outformat, LYP_WITHSIBLINGS | LYP_FORMAT | printopt);
        }
    }

    ret = 0;

cleanup:
    free(*argv);
    free(argv);

    if (output && (output != stdout)) {
        fclose(output);
    }

    lyd_free_withsiblings(val_tree);
    lyd_free_withsiblings(data);

    return ret;
}